

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O0

void MPIX_intra_recv_map(comm_pkg *comm,char *intra_recv_data,void *inter_recv_data,
                        MPI_Datatype mpi_type,MPI_Comm mpi_comm)

{
  undefined8 in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  int i;
  int ctr;
  int *int_ptr;
  char *char_ptr;
  int type_size;
  int size;
  int addr;
  int idx;
  int local_50;
  undefined4 local_4c [3];
  long local_40;
  int local_38;
  undefined4 local_34 [2];
  int local_2c;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_10;
  long local_8;
  
  local_40 = in_RDX;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  MPI_Type_size(in_RCX,&local_38);
  MPI_Pack_size(*(undefined4 *)(*(long *)(local_8 + 8) + 4),local_20,local_28,local_34);
  local_4c[0] = 0;
  for (local_50 = 0; local_50 < *(int *)(*(long *)(local_8 + 8) + 4); local_50 = local_50 + 1) {
    local_2c = *(int *)(*(long *)(*(long *)(local_8 + 8) + 0x18) + (long)local_50 * 4);
    MPI_Unpack(local_10,local_34[0],local_4c,local_40 + local_2c * local_38,1,local_20,local_28);
  }
  return;
}

Assistant:

static void MPIX_intra_recv_map(comm_pkg* comm, char* intra_recv_data, void* inter_recv_data,
        MPI_Datatype mpi_type, MPI_Comm mpi_comm)
{
    int idx, addr;
    int size, type_size;
    char* char_ptr = reinterpret_cast<char*>(inter_recv_data);
    int* int_ptr = reinterpret_cast<int*>(inter_recv_data);
    MPI_Type_size(mpi_type, &type_size);
    MPI_Pack_size(comm->recv_data->size_msgs, mpi_type, mpi_comm, &size);

    int ctr = 0;
    for (int i = 0; i < comm->recv_data->size_msgs; i++)
    {
        idx = comm->recv_data->indices[i];
        MPI_Unpack(intra_recv_data, size, &ctr, &(char_ptr[idx*type_size]), 
                1, mpi_type, mpi_comm);
    }
}